

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O2

void anon_unknown.dwarf_386017::cmExecuteProcessCommandFixText
               (vector<char,_std::allocator<char>_> *output,bool strip_trailing_whitespace)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char local_19;
  
  uVar5 = 0;
  uVar7 = 0;
  do {
    pcVar2 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar2;
    uVar8 = (ulong)uVar7;
    do {
      uVar9 = (ulong)uVar5;
      if (uVar6 <= uVar8) {
        if (strip_trailing_whitespace && uVar5 != 0) goto LAB_001e45ef;
        goto LAB_001e461d;
      }
      iVar3 = (int)uVar8;
      uVar7 = iVar3 + 1;
      cVar1 = pcVar2[uVar8];
      uVar8 = (ulong)uVar7;
    } while ((cVar1 == '\0') || (((cVar1 == '\r' && (uVar7 < uVar6)) && (pcVar2[uVar7] == '\n'))));
    uVar5 = uVar5 + 1;
    pcVar2[uVar9] = cVar1;
    uVar7 = iVar3 + 1;
  } while( true );
LAB_001e45ef:
  cVar1 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar9 - 1];
  bVar4 = cmIsSpace(cVar1);
  if (((!bVar4) && (cVar1 != '\r')) && (cVar1 != '\n')) {
    uVar5 = (uint)uVar9;
    goto LAB_001e461d;
  }
  uVar9 = uVar9 - 1;
  if (uVar9 == 0) {
    uVar5 = 0;
LAB_001e461d:
    std::vector<char,_std::allocator<char>_>::resize(output,(ulong)uVar5);
    local_19 = '\0';
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(output,&local_19);
    return;
  }
  goto LAB_001e45ef;
}

Assistant:

void cmExecuteProcessCommandFixText(std::vector<char>& output,
                                    bool strip_trailing_whitespace)
{
  // Remove \0 characters and the \r part of \r\n pairs.
  unsigned int in_index = 0;
  unsigned int out_index = 0;
  while (in_index < output.size()) {
    char c = output[in_index++];
    if ((c != '\r' ||
         !(in_index < output.size() && output[in_index] == '\n')) &&
        c != '\0') {
      output[out_index++] = c;
    }
  }

  // Remove trailing whitespace if requested.
  if (strip_trailing_whitespace) {
    while (out_index > 0 &&
           cmExecuteProcessCommandIsWhitespace(output[out_index - 1])) {
      --out_index;
    }
  }

  // Shrink the vector to the size needed.
  output.resize(out_index);

  // Put a terminator on the text string.
  output.push_back('\0');
}